

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int disposition_get_state(DISPOSITION_HANDLE disposition,AMQP_VALUE *state_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  DISPOSITION_INSTANCE *disposition_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *state_value_local;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._4_4_ = 0x22d1;
  }
  else {
    _item_count = state_value;
    state_value_local = &disposition->composite_value;
    iVar1 = amqpvalue_get_composite_item_count
                      (disposition->composite_value,(uint32_t *)&disposition_instance);
    if (iVar1 == 0) {
      if ((uint)disposition_instance < 5) {
        disposition_instance._4_4_ = 0x22df;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(disposition->composite_value,4);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          disposition_instance._4_4_ = 0x22e7;
        }
        else {
          *_item_count = value;
          disposition_instance._4_4_ = 0;
        }
      }
    }
    else {
      disposition_instance._4_4_ = 0x22d9;
    }
  }
  return disposition_instance._4_4_;
}

Assistant:

int disposition_get_state(DISPOSITION_HANDLE disposition, AMQP_VALUE* state_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        if (amqpvalue_get_composite_item_count(disposition_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(disposition_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *state_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}